

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
Execute<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
          (ArgMinMaxBase<duckdb::LessThan,true> *this,
          ArgMinMaxState<double,_duckdb::string_t> *state,double x_data,string_t y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  undefined8 uVar2;
  string_t new_value;
  anon_union_16_2_67f50693_for_value local_20;
  
  uVar2 = y_data.value._8_8_;
  local_20.pointer.ptr = (char *)y_data.value._0_8_;
  local_20._0_8_ = state;
  bVar1 = string_t::StringComparisonOperators::GreaterThan
                    ((string_t *)(this + 0x10),(string_t *)&local_20.pointer);
  if (bVar1) {
    *(double *)(this + 8) = x_data;
    new_value.value.pointer.ptr = (char *)uVar2;
    new_value.value._0_8_ = local_20.pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)(this + 0x10),(string_t *)local_20._0_8_,new_value);
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}